

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface_tests.cpp
# Opt level: O0

void __thiscall validationinterface_tests::TestInterface::~TestInterface(TestInterface *this)

{
  long lVar1;
  TestInterface *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~TestInterface(in_RDI);
  operator_delete(in_RDI,0x50);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

virtual ~TestInterface()
    {
        if (m_on_destroy) m_on_destroy();
    }